

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress.c
# Opt level: O0

int32_t zng_compress2(uchar *dest,size_t *destLen,uchar *source,size_t sourceLen,int level)

{
  ulong in_RCX;
  ulong *in_RSI;
  size_t left;
  uint max;
  int err;
  zng_stream stream;
  undefined4 in_stack_ffffffffffffff48;
  int32_t in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  ulong local_a8;
  uint local_90;
  uint local_78;
  undefined4 local_70;
  int32_t in_stack_ffffffffffffff94;
  zng_stream *in_stack_ffffffffffffff98;
  ulong local_28;
  int32_t local_4;
  
  local_a8 = *in_RSI;
  *in_RSI = 0;
  local_4 = zng_deflateInit((zng_stream *)
                            CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                            in_stack_ffffffffffffff4c);
  if (local_4 == 0) {
    local_78 = 0;
    local_90 = 0;
    local_28 = in_RCX;
    do {
      if (local_78 == 0) {
        if (local_a8 < 0x100000000) {
          local_78 = (uint)local_a8;
        }
        else {
          local_78 = 0xffffffff;
        }
        local_a8 = local_a8 - local_78;
      }
      if (local_90 == 0) {
        if (local_28 < 0x100000000) {
          local_90 = (uint)local_28;
        }
        else {
          local_90 = 0xffffffff;
        }
        local_28 = local_28 - local_90;
      }
      local_4 = zng_deflate(in_stack_ffffffffffffff98,in_stack_ffffffffffffff94);
    } while (local_4 == 0);
    *in_RSI = CONCAT44(in_stack_ffffffffffffff94,local_70);
    zng_deflateEnd((zng_stream *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    if (local_4 == 1) {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int Z_EXPORT PREFIX(compress2)(unsigned char *dest, z_uintmax_t *destLen, const unsigned char *source,
                        z_uintmax_t sourceLen, int level) {
    PREFIX3(stream) stream;
    int err;
    const unsigned int max = (unsigned int)-1;
    z_size_t left;

    left = *destLen;
    *destLen = 0;

    stream.zalloc = NULL;
    stream.zfree = NULL;
    stream.opaque = NULL;

    err = PREFIX(deflateInit)(&stream, level);
    if (err != Z_OK)
        return err;

    stream.next_out = dest;
    stream.avail_out = 0;
    stream.next_in = (z_const unsigned char *)source;
    stream.avail_in = 0;

    do {
        if (stream.avail_out == 0) {
            stream.avail_out = left > (unsigned long)max ? max : (unsigned int)left;
            left -= stream.avail_out;
        }
        if (stream.avail_in == 0) {
            stream.avail_in = sourceLen > (unsigned long)max ? max : (unsigned int)sourceLen;
            sourceLen -= stream.avail_in;
        }
        err = PREFIX(deflate)(&stream, sourceLen ? Z_NO_FLUSH : Z_FINISH);
    } while (err == Z_OK);

    *destLen = stream.total_out;
    PREFIX(deflateEnd)(&stream);
    return err == Z_STREAM_END ? Z_OK : err;
}